

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_twod_analytic_node(REF_NODE ref_node,char *version)

{
  undefined1 (*pauVar1) [16];
  double *pdVar2;
  double dVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  REF_INT node;
  long lVar9;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 local_108 [32];
  double local_e8;
  double dStack_e0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  double local_b0;
  double local_a8;
  undefined8 local_a0;
  double local_98;
  double local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  REF_DBL m [6];
  
  lVar10 = 0;
  lVar9 = 0;
  bVar5 = false;
  local_e8 = 1.0;
  dStack_e0 = 1.0;
  local_108._0_16_ = ZEXT816(0);
  do {
    if (ref_node->max <= lVar9) {
      if (!bVar5) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x110,"ref_metric_twod_analytic_node","metric unknown");
      }
      return (uint)!bVar5;
    }
    if (-1 < ref_node->global[lVar9]) {
      iVar6 = strcmp(version,"larsson1");
      node = (REF_INT)lVar9;
      if (iVar6 == 0) {
        pauVar1 = (undefined1 (*) [16])((long)ref_node->real + lVar10);
        dVar13 = *(double *)(*pauVar1 + 8);
        local_108._0_16_ = *pauVar1;
        dVar12 = *(double *)*pauVar1 * 6.28318530717958;
        dVar14 = sin(dVar12);
        dVar13 = dVar13 * 6.28318530717958;
        dVar3 = sin(dVar13);
        dVar12 = sin(dVar12);
        dVar13 = sin(dVar13);
        uVar7 = ref_node_metric_form
                          (ref_node,node,dVar3 * dVar14 * 200.0 + 400.0,0.0,0.0,
                           dVar12 * -200.0 * dVar13 + 400.0,0.0,1.0);
        bVar5 = true;
        if (uVar7 != 0) {
          uVar11 = (ulong)uVar7;
          uVar8 = 0x94;
          goto LAB_00184d28;
        }
      }
      else {
        iVar6 = strcmp(version,"larsson2");
        if (iVar6 == 0) {
          local_108._0_16_ = *(undefined1 (*) [16])((long)ref_node->real + lVar10);
          dVar14 = pow(local_108._8_8_ * 0.05 + 0.05,-2.0);
          dVar13 = pow(local_108._8_8_ * 0.12 + 0.04,-2.0);
          uVar7 = ref_node_metric_form(ref_node,node,dVar14,0.0,0.0,dVar13,0.0,1.0);
          bVar5 = true;
          if (uVar7 != 0) {
            uVar11 = (ulong)uVar7;
            uVar8 = 0xa0;
            goto LAB_00184d28;
          }
        }
        else {
          iVar6 = strcmp(version,"iso01");
          if (iVar6 == 0) {
            uVar7 = ref_node_metric_form
                              (ref_node,node,99.99999999999999,0.0,0.0,99.99999999999999,0.0,1.0);
            bVar5 = true;
            if (uVar7 != 0) {
              uVar11 = (ulong)uVar7;
              uVar8 = 0xa8;
              goto LAB_00184d28;
            }
          }
          else {
            iVar6 = strcmp(version,"isorad");
            if (iVar6 == 0) {
              dVar14 = *(double *)((long)ref_node->real + lVar10);
              pdVar2 = (double *)((long)ref_node->real + lVar10 + 8);
              dVar13 = *pdVar2;
              dVar3 = pdVar2[1];
              dVar14 = SQRT(dVar3 * dVar3 + dVar14 * dVar14 + dVar13 * dVar13) * 0.1 + 0.1;
              dVar14 = 1.0 / (dVar14 * dVar14);
              uVar7 = ref_node_metric_form(ref_node,node,dVar14,0.0,0.0,dVar14,0.0,1.0);
              bVar5 = true;
              if (uVar7 != 0) {
                uVar11 = (ulong)uVar7;
                uVar8 = 0xb3;
                goto LAB_00184d28;
              }
            }
            else {
              iVar6 = strcmp(version,"masabl-1");
              if (iVar6 == 0) {
                dVar14 = cos((*(double *)((long)ref_node->real + lVar10) + -0.5) * 3.14159265358979)
                ;
                dVar14 = dVar14 * 0.2 + 0.01;
                dVar13 = exp(*(double *)((long)ref_node->real + lVar10 + 8) * 6.0);
                uVar7 = ref_node_metric_form
                                  (ref_node,node,1.0 / (dVar14 * dVar14),0.0,0.0,
                                   1.0 / (dVar13 * 0.001 * dVar13 * 0.001),0.0,1.0);
                bVar5 = true;
                if (uVar7 != 0) {
                  uVar11 = (ulong)uVar7;
                  uVar8 = 0xbf;
                  goto LAB_00184d28;
                }
              }
              else {
                iVar6 = strcmp(version,"side");
                if (iVar6 == 0) {
                  dVar14 = *(double *)((long)ref_node->real + lVar10 + 8) * 0.09000000000000001 +
                           0.01;
                  uVar7 = ref_node_metric_form
                                    (ref_node,node,99.99999999999999,0.0,0.0,1.0 / (dVar14 * dVar14)
                                     ,0.0,1.0);
                  bVar5 = true;
                  if (uVar7 != 0) {
                    uVar11 = (ulong)uVar7;
                    uVar8 = 0xc9;
                    goto LAB_00184d28;
                  }
                }
                else {
                  iVar6 = strcmp(version,"linear-0001");
                  if (iVar6 == 0) {
                    dVar14 = *(double *)((long)ref_node->real + lVar10 + 8) + -0.5;
                    if (dVar14 <= -dVar14) {
                      dVar14 = -dVar14;
                    }
                    dVar14 = dVar14 * 0.0999 + dVar14 * 0.0999 + 0.0001;
                    uVar7 = ref_node_metric_form
                                      (ref_node,node,99.99999999999999,0.0,0.0,
                                       1.0 / (dVar14 * dVar14),0.0,1.0);
                    bVar5 = true;
                    if (uVar7 != 0) {
                      uVar11 = (ulong)uVar7;
                      uVar8 = 0xd3;
                      goto LAB_00184d28;
                    }
                  }
                  else {
                    iVar6 = strcmp(version,"linear-01");
                    if (iVar6 == 0) {
                      dVar14 = *(double *)((long)ref_node->real + lVar10 + 8) + -0.5;
                      if (dVar14 <= -dVar14) {
                        dVar14 = -dVar14;
                      }
                      dVar14 = dVar14 * 0.09000000000000001 + dVar14 * 0.09000000000000001 + 0.01;
                      uVar7 = ref_node_metric_form
                                        (ref_node,node,99.99999999999999,0.0,0.0,
                                         1.0 / (dVar14 * dVar14),0.0,1.0);
                      bVar5 = true;
                      if (uVar7 != 0) {
                        uVar11 = (ulong)uVar7;
                        uVar8 = 0xdd;
                        goto LAB_00184d28;
                      }
                    }
                    else {
                      iVar6 = strcmp(version,"polar-2");
                      if (iVar6 == 0) {
                        pauVar1 = (undefined1 (*) [16])((long)ref_node->real + lVar10);
                        local_108._0_16_ = *pauVar1;
                        dVar14 = SQRT(*(double *)*pauVar1 * *(double *)*pauVar1 +
                                      *(double *)(*pauVar1 + 8) * *(double *)(*pauVar1 + 8)) + -0.5;
                        if (dVar14 <= -dVar14) {
                          dVar14 = -dVar14;
                        }
                        dVar13 = dVar14 * 10.0;
                        if (1.0 <= dVar14 * 10.0) {
                          dVar13 = 1.0;
                        }
                        local_e8 = dVar14 * 0.198 + 0.001;
                        dStack_e0 = dVar13 * 0.1 + (1.0 - dVar13) * 0.025;
                        bVar5 = true;
                      }
                      iVar6 = strcmp(version,"radial-1");
                      if (iVar6 == 0) {
                        pdVar2 = (double *)((long)ref_node->real + lVar10);
                        local_108._0_8_ = *pdVar2 + 0.5;
                        local_108._8_8_ = pdVar2[1] + -0.5;
                        atan2((double)local_108._8_8_,(double)local_108._0_8_);
                        bVar5 = true;
                        local_e8 = 0.01;
                        dStack_e0 = 0.1;
                      }
                      iVar6 = strcmp(version,"circle-1");
                      if (iVar6 == 0) {
                        pdVar2 = (double *)((long)ref_node->real + lVar10);
                        local_108._0_8_ = *pdVar2 + 0.5;
                        local_108._8_8_ = pdVar2[1] + -0.5;
                        dVar13 = SQRT((double)local_108._0_8_ * (double)local_108._0_8_ +
                                      (double)local_108._8_8_ * (double)local_108._8_8_);
                        atan2((double)local_108._8_8_,(double)local_108._0_8_);
                        dVar14 = 1.0 - dVar13;
                        if (dVar14 <= -dVar14) {
                          dVar14 = -dVar14;
                        }
                        local_e8 = dVar14 * 1.5 + 0.0005;
                        dStack_e0 = dVar13 * 0.1 + dVar14 * 1.5;
                        bVar5 = true;
                      }
                      dVar14 = atan2((double)local_108._8_8_,(double)local_108._0_8_);
                      auVar4._8_8_ = dStack_e0 * dStack_e0;
                      auVar4._0_8_ = local_e8 * local_e8;
                      local_c8 = divpd(_DAT_001f4270,auVar4);
                      local_b8 = 0x3ff0000000000000;
                      local_b0 = cos(dVar14);
                      local_a8 = sin(dVar14);
                      local_a0 = 0;
                      local_98 = sin(dVar14);
                      local_98 = -local_98;
                      local_90 = cos(dVar14);
                      local_88 = 0;
                      uStack_80 = 0;
                      local_78 = 0;
                      local_70 = 0x3ff0000000000000;
                      ref_matrix_form_m((REF_DBL *)local_c8,m);
                      uVar7 = ref_node_metric_set(ref_node,node,m);
                      if (uVar7 != 0) {
                        uVar11 = (ulong)uVar7;
                        uVar8 = 0x10d;
LAB_00184d28:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,uVar8,"ref_metric_twod_analytic_node",uVar11,"set node met");
                        return (REF_STATUS)uVar11;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    lVar9 = lVar9 + 1;
    lVar10 = lVar10 + 0x78;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_twod_analytic_node(REF_NODE ref_node,
                                                 const char *version) {
  REF_INT node;
  REF_DBL x = 0, y = 0, r, t;
  REF_DBL h_z = 1, h_t = 1, h_r = 1, h0, h, hh, hy, hx, c, k1, d0;
  REF_DBL d[12], m[6];
  REF_BOOL metric_recognized = REF_FALSE;

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(version, "larsson1") == 0) {
      REF_DBL c1 = 200.0;
      REF_DBL c2 = 200.0;
      REF_DBL m11;
      REF_DBL m22;
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      m11 =
          400.0 + c1 * sin(2.0 * ref_math_pi * x) * sin(2.0 * ref_math_pi * y);
      m22 =
          400.0 - c2 * sin(2.0 * ref_math_pi * x) * sin(2.0 * ref_math_pi * y);
      RSS(ref_node_metric_form(ref_node, node, m11, 0, 0, m22, 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "larsson2") == 0) {
      REF_DBL m11;
      REF_DBL m22;
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      m11 = pow(0.05 + 0.05 * y, -2);
      m22 = pow(0.04 + 0.12 * y, -2);
      RSS(ref_node_metric_form(ref_node, node, m11, 0, 0, m22, 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "iso01") == 0) {
      metric_recognized = REF_TRUE;
      h = 0.1;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (h * h), 0, 0,
                               1.0 / (h * h), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "isorad") == 0) {
      metric_recognized = REF_TRUE;
      r = sqrt(pow(ref_node_xyz(ref_node, 0, node), 2) +
               pow(ref_node_xyz(ref_node, 1, node), 2) +
               pow(ref_node_xyz(ref_node, 2, node), 2));
      h = 0.1 + 0.1 * r;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (h * h), 0, 0,
                               1.0 / (h * h), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "masabl-1") == 0) {
      metric_recognized = REF_TRUE;
      hx = 0.01 +
           0.2 * cos(ref_math_pi * (ref_node_xyz(ref_node, 0, node) - 0.5));
      c = 0.001;
      k1 = 6.0;
      hy = c * exp(k1 * ref_node_xyz(ref_node, 1, node));
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (hx * hx), 0, 0,
                               1.0 / (hy * hy), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "side") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.01;
      hh = h + (h0 - h) * ref_node_xyz(ref_node, 1, node);
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "linear-0001") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.0001;
      hh = h + (0.1 - h) * ABS(ref_node_xyz(ref_node, 1, node) - 0.5) / 0.5;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "linear-01") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.01;
      hh = h + (0.1 - h) * ABS(ref_node_xyz(ref_node, 1, node) - 0.5) / 0.5;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "polar-2") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      r = sqrt(x * x + y * y);
      h_z = 1.0;
      h_t = 0.1;
      h0 = 0.001;
      h_r = h0 + 2 * (0.1 - h0) * ABS(r - 0.5);
      d0 = MIN(10.0 * ABS(r - 0.5), 1.0);
      h_t = 0.1 * d0 + 0.025 * (1.0 - d0);
    }
    if (strcmp(version, "radial-1") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node) + 0.5;
      y = ref_node_xyz(ref_node, 1, node) - 0.5;
      t = atan2(y, x);
      h_z = 1.0;
      h_t = 0.1;
      h_r = 0.01;
    }
    if (strcmp(version, "circle-1") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node) + 0.5;
      y = ref_node_xyz(ref_node, 1, node) - 0.5;
      r = sqrt(x * x + y * y);
      t = atan2(y, x);
      h_z = 1.0;
      h_r = 0.0005 + 1.5 * ABS(1.0 - r);
      h_t = 0.1 * r + 1.5 * ABS(1.0 - r);
    }
    t = atan2(y, x);
    ref_matrix_eig(d, 0) = 1.0 / (h_r * h_r);
    ref_matrix_eig(d, 1) = 1.0 / (h_t * h_t);
    ref_matrix_eig(d, 2) = 1.0 / (h_z * h_z);
    ref_matrix_vec(d, 0, 0) = cos(t);
    ref_matrix_vec(d, 1, 0) = sin(t);
    ref_matrix_vec(d, 2, 0) = 0.0;
    ref_matrix_vec(d, 0, 1) = -sin(t);
    ref_matrix_vec(d, 1, 1) = cos(t);
    ref_matrix_vec(d, 2, 1) = 0.0;
    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 0.0;
    ref_matrix_vec(d, 2, 2) = 1.0;
    ref_matrix_form_m(d, m);
    RSS(ref_node_metric_set(ref_node, node, m), "set node met");
  }

  RAS(metric_recognized, "metric unknown");

  return REF_SUCCESS;
}